

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
CoOccurrenceBuild(WebPPicture *pic,uint32_t *palette,uint32_t num_colors,uint32_t *cooccurrence)

{
  void *pvVar1;
  int iVar2;
  long in_RCX;
  ulong uVar3;
  int in_EDX;
  long in_RDI;
  uint32_t top_idx;
  uint32_t left_idx;
  uint32_t pix;
  uint32_t palette_sorted [256];
  uint32_t idx_map [256];
  uint32_t prev_idx;
  uint32_t prev_pix;
  uint32_t *src;
  int y;
  int x;
  uint32_t *line_tmp;
  uint32_t *line_current;
  uint32_t *line_top;
  uint32_t *lines;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  uint32_t color;
  uint32_t *in_stack_fffffffffffff798;
  uint32_t *in_stack_fffffffffffff7a0;
  uint32_t in_stack_fffffffffffff7ac;
  uint32_t *in_stack_fffffffffffff7b0;
  int local_468 [258];
  int local_60;
  uint32_t local_5c;
  uint *local_58;
  int local_50;
  int local_4c;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  long local_28;
  int local_1c;
  long local_10;
  WebPEncodingError local_4;
  
  local_58 = *(uint **)(in_RDI + 0x48);
  local_5c = *local_58 ^ 0xffffffff;
  local_60 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  memset(local_468,0,0x400);
  local_38 = WebPSafeMalloc((uint64_t)in_stack_fffffffffffff798,
                            CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  if (local_38 == (void *)0x0) {
    local_4 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    local_40 = (void *)((long)local_38 + (long)*(int *)(local_10 + 8) * 4);
    local_30 = local_38;
    PrepareMapToPalette(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
                        in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    for (local_50 = 0; local_50 < *(int *)(local_10 + 0xc); local_50 = local_50 + 1) {
      for (local_4c = 0; local_4c < *(int *)(local_10 + 8); local_4c = local_4c + 1) {
        color = local_58[local_4c];
        if (color != local_5c) {
          iVar2 = SearchColorNoIdx((uint32_t *)&stack0xfffffffffffff798,color,local_1c);
          local_60 = local_468[iVar2];
          local_5c = color;
        }
        *(int *)((long)local_40 + (long)local_4c * 4) = local_60;
        if ((0 < local_4c) && (local_60 != *(int *)((long)local_40 + (long)(local_4c + -1) * 4))) {
          iVar2 = *(int *)((long)local_40 + (long)(local_4c + -1) * 4);
          uVar3 = (ulong)(uint)(local_60 * local_1c + iVar2);
          *(int *)(local_28 + uVar3 * 4) = *(int *)(local_28 + uVar3 * 4) + 1;
          uVar3 = (ulong)(uint)(iVar2 * local_1c + local_60);
          *(int *)(local_28 + uVar3 * 4) = *(int *)(local_28 + uVar3 * 4) + 1;
        }
        if ((0 < local_50) && (local_60 != *(int *)((long)local_38 + (long)local_4c * 4))) {
          iVar2 = *(int *)((long)local_38 + (long)local_4c * 4);
          uVar3 = (ulong)(uint)(local_60 * local_1c + iVar2);
          *(int *)(local_28 + uVar3 * 4) = *(int *)(local_28 + uVar3 * 4) + 1;
          uVar3 = (ulong)(uint)(iVar2 * local_1c + local_60);
          *(int *)(local_28 + uVar3 * 4) = *(int *)(local_28 + uVar3 * 4) + 1;
        }
      }
      local_48 = local_38;
      pvVar1 = local_40;
      local_40 = local_38;
      local_58 = local_58 + *(int *)(local_10 + 0x50);
      local_38 = pvVar1;
    }
    WebPSafeFree((void *)0x18a932);
    local_4 = VP8_ENC_OK;
  }
  return local_4;
}

Assistant:

static WebPEncodingError CoOccurrenceBuild(const WebPPicture* const pic,
                                           const uint32_t* const palette,
                                           uint32_t num_colors,
                                           uint32_t* cooccurrence) {
  uint32_t *lines, *line_top, *line_current, *line_tmp;
  int x, y;
  const uint32_t* src = pic->argb;
  uint32_t prev_pix = ~src[0];
  uint32_t prev_idx = 0u;
  uint32_t idx_map[MAX_PALETTE_SIZE] = {0};
  uint32_t palette_sorted[MAX_PALETTE_SIZE];
  lines = (uint32_t*)WebPSafeMalloc(2 * pic->width, sizeof(*lines));
  if (lines == NULL) return VP8_ENC_ERROR_OUT_OF_MEMORY;
  line_top = &lines[0];
  line_current = &lines[pic->width];
  PrepareMapToPalette(palette, num_colors, palette_sorted, idx_map);
  for (y = 0; y < pic->height; ++y) {
    for (x = 0; x < pic->width; ++x) {
      const uint32_t pix = src[x];
      if (pix != prev_pix) {
        prev_idx = idx_map[SearchColorNoIdx(palette_sorted, pix, num_colors)];
        prev_pix = pix;
      }
      line_current[x] = prev_idx;
      // 4-connectivity is what works best as mentioned in "On the relation
      // between Memon's and the modified Zeng's palette reordering methods".
      if (x > 0 && prev_idx != line_current[x - 1]) {
        const uint32_t left_idx = line_current[x - 1];
        ++cooccurrence[prev_idx * num_colors + left_idx];
        ++cooccurrence[left_idx * num_colors + prev_idx];
      }
      if (y > 0 && prev_idx != line_top[x]) {
        const uint32_t top_idx = line_top[x];
        ++cooccurrence[prev_idx * num_colors + top_idx];
        ++cooccurrence[top_idx * num_colors + prev_idx];
      }
    }
    line_tmp = line_top;
    line_top = line_current;
    line_current = line_tmp;
    src += pic->argb_stride;
  }
  WebPSafeFree(lines);
  return VP8_ENC_OK;
}